

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_controller.cpp
# Opt level: O1

void __thiscall so_5::stats::impl::std_controller_t::body(std_controller_t *this)

{
  duration dVar1;
  long lVar2;
  long lVar3;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_48;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  
  while( true ) {
    local_48._M_owns = false;
    local_48._M_device = &this->m_data_lock;
    std::unique_lock<std::mutex>::lock(&local_48);
    local_48._M_owns = true;
    if (this->m_shutdown_initiated != false) break;
    dVar1 = distribute_current_data(this);
    lVar2 = (this->m_distribution_period).__r;
    lVar3 = lVar2 - dVar1.__r;
    if (lVar3 != 0 && dVar1.__r <= lVar2) {
      lVar2 = std::chrono::_V2::steady_clock::now();
      local_38.__d.__r = (duration)(lVar3 + lVar2);
      std::condition_variable::
      __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                (&this->m_wake_up_cond,&local_48,&local_38);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_48);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_48);
  return;
}

Assistant:

void
std_controller_t::body()
	{
		while( true )
			{
				std::unique_lock< std::mutex > lock{ m_data_lock };

				if( m_shutdown_initiated )
					return;

				const auto actual_duration = distribute_current_data();

				if( actual_duration < m_distribution_period )
					// There is some time to sleep.
					m_wake_up_cond.wait_for(
							lock,
							m_distribution_period - actual_duration );
			}
	}